

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

Message * __thiscall testing::Message::operator<<(Message *this,wchar_t *wide_c_str)

{
  Message *pMVar1;
  wchar_t *in_RDX;
  string local_30;
  
  internal::String::ShowWideCString_abi_cxx11_(&local_30,(String *)wide_c_str,in_RDX);
  pMVar1 = operator<<(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pMVar1;
}

Assistant:

Message& Message::operator <<(const wchar_t* wide_c_str) {
  return *this << internal::String::ShowWideCString(wide_c_str);
}